

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_MuxDelayPrint_rec(Str_Mux_t *pMux,int i)

{
  Str_Mux_t *pMux_00;
  Str_Mux_t *pFanin;
  int fShowDelay;
  int i_local;
  Str_Mux_t *pMux_local;
  
  if (pMux->Edge[i].Fan < 1) {
    printf("%d",(ulong)(uint)-pMux->Edge[i].Fan);
    printf("{%d}",(ulong)(uint)pMux->Edge[i].FanDel);
  }
  else {
    pMux_00 = Str_MuxFanin(pMux,i);
    printf("[ ");
    if (pMux_00->Edge[0].fCompl != 0) {
      printf("!");
    }
    Str_MuxDelayPrint_rec(pMux_00,0);
    printf("|");
    if (pMux_00->Edge[1].fCompl != 0) {
      printf("!");
    }
    Str_MuxDelayPrint_rec(pMux_00,1);
    printf("(");
    if (pMux_00->Edge[2].fCompl != 0) {
      printf("!");
    }
    Str_MuxDelayPrint_rec(pMux_00,2);
    printf(")");
    printf(" ]");
  }
  return;
}

Assistant:

void Str_MuxDelayPrint_rec( Str_Mux_t * pMux, int i )
{
    int fShowDelay = 1;
    Str_Mux_t * pFanin;
    if ( pMux->Edge[i].Fan <= 0 )
    {
        printf( "%d", -pMux->Edge[i].Fan );
        if ( fShowDelay )
            printf( "{%d}", pMux->Edge[i].FanDel );
        return;
    }
    pFanin = Str_MuxFanin( pMux, i );
    printf( "[ " );
    if ( pFanin->Edge[0].fCompl )
        printf( "!" );
    Str_MuxDelayPrint_rec( pFanin, 0 );
    printf( "|" );
    if ( pFanin->Edge[1].fCompl )
        printf( "!" );
    Str_MuxDelayPrint_rec( pFanin, 1 );
    printf( "(" );
    if ( pFanin->Edge[2].fCompl )
        printf( "!" );
    Str_MuxDelayPrint_rec( pFanin, 2 );
    printf( ")" );
    printf( " ]" );
}